

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render_tree.hpp
# Opt level: O0

void __thiscall
duckdb::RenderTreeNode::RenderTreeNode
          (RenderTreeNode *this,string *name,
          InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *extra_text)

{
  InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDX;
  string *in_RSI;
  InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDI;
  
  ::std::__cxx11::string::string((string *)in_RDI,in_RSI);
  InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::InsertionOrderPreservingMap(in_RDI,in_RDX);
  vector<duckdb::RenderTreeNode::Coordinate,_true>::vector
            ((vector<duckdb::RenderTreeNode::Coordinate,_true> *)0x2e0092b);
  return;
}

Assistant:

RenderTreeNode(const string &name, InsertionOrderPreservingMap<string> extra_text)
	    : name(name), extra_text(std::move(extra_text)) {
	}